

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O1

Box * __thiscall libDAI::Box::normalized(Box *__return_storage_ptr__,Box *this)

{
  ulong uVar1;
  long lVar2;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> ep;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> local_40;
  
  extremePoints(&local_40,this);
  if (local_40.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_40.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      TProb<double>::normalize
                ((TProb<double> *)
                 ((long)&((local_40.
                           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_p).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2),NORMPROB);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar1 < (ulong)(((long)local_40.
                                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_40.
                                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  Box(__return_storage_ptr__,&this->_vars,&local_40);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Box normalized() const {
                std::vector<Prob> ep = extremePoints();
                for( size_t l = 0; l < ep.size(); l++ )
                    ep[l].normalize();
                return Box( _vars, ep );
            }